

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.h
# Opt level: O0

int encode_head(char *data,int len,int value)

{
  int local_2c;
  byte local_25;
  int idx;
  int iStack_20;
  uchar c;
  int count;
  int value_local;
  int len_local;
  char *data_local;
  
  data_local._4_4_ = head_size(value);
  if ((data_local._4_4_ < 1) || (len < data_local._4_4_)) {
    data_local._4_4_ = -1;
  }
  else if (data_local._4_4_ == 1) {
    *data = (char)value;
  }
  else {
    local_25 = 0x80;
    iStack_20 = value;
    for (local_2c = 0; local_2c < data_local._4_4_; local_2c = local_2c + 1) {
      data[(data_local._4_4_ - local_2c) + -1] = (byte)iStack_20 & 0x3f | 0x80;
      local_25 = local_25 | (byte)((int)(uint)local_25 >> 1);
      iStack_20 = iStack_20 >> 6;
    }
    *data = *data | local_25 << 1;
  }
  return data_local._4_4_;
}

Assistant:

inline int encode_head(char* data, int len, int value)
{
    int count = head_size(value);
    if (count <= 0 || len < count)
        return -1;

    if (count == 1) {
        data[0] = (char)value;
        return count;
    }

    unsigned char c = 0x80;
    for (int idx = 0; idx < count; idx++) {
        data[count - idx - 1] = (value & 0x3F) | 0x80;
        c |= (c >> 1);
        value >>= 6;
    }
    data[0] |= (c << 1);
    return count;
}